

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall foxxll::config::load_config_file(config *this,string *config_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pdVar2;
  config *pcVar3;
  char cVar4;
  istream *piVar5;
  ostream *poVar6;
  runtime_error *this_00;
  disk_list_type *this_01;
  string line;
  vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> flash_list;
  disk_config entry;
  ifstream cfg_file;
  string local_418;
  disk_list_type local_3f8;
  string *local_3e0;
  config *local_3d8;
  string local_3d0 [32];
  disk_config local_3b0 [3];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_3f8.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_238,(config_path->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    local_418._M_string_length = 0;
    local_418.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_3b0[0].io_impl.field_2;
    local_3e0 = config_path;
    local_3d8 = this;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_418,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      if ((local_418._M_string_length != 0) && (*local_418._M_dataplus._M_p != '#')) {
        local_3b0[0].path._M_dataplus._M_p = (pointer)&local_3b0[0].path.field_2;
        local_3b0[0].path._M_string_length = 0;
        local_3b0[0].path.field_2._M_local_buf[0] = '\0';
        local_3b0[0].size = 0;
        local_3b0[0].io_impl._M_string_length = 0;
        local_3b0[0].io_impl.field_2._M_local_buf[0] = '\0';
        local_3b0[0].autogrow = true;
        local_3b0[0].delete_on_exit = false;
        local_3b0[0].direct = DIRECT_TRY;
        local_3b0[0].flash = false;
        local_3b0[0].queue = -1;
        local_3b0[0].device_id = 0xffffffff;
        local_3b0[0].raw_device = false;
        local_3b0[0].unlink_on_open = false;
        local_3b0[0].queue_length = 0;
        local_3b0[0].io_impl._M_dataplus._M_p = (pointer)paVar1;
        disk_config::parse_line(local_3b0,&local_418);
        this_01 = &this->disks_list;
        if (local_3b0[0].flash != false) {
          this_01 = &local_3f8;
        }
        std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::push_back
                  (this_01,local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0].io_impl._M_dataplus._M_p != paVar1) {
          operator_delete(local_3b0[0].io_impl._M_dataplus._M_p,
                          CONCAT71(local_3b0[0].io_impl.field_2._M_allocated_capacity._1_7_,
                                   local_3b0[0].io_impl.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0].path._M_dataplus._M_p != &local_3b0[0].path.field_2) {
          operator_delete(local_3b0[0].path._M_dataplus._M_p,
                          CONCAT71(local_3b0[0].path.field_2._M_allocated_capacity._1_7_,
                                   local_3b0[0].path.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    std::ifstream::close();
    pcVar3 = local_3d8;
    pdVar2 = (local_3d8->disks_list).
             super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_3d8->first_flash =
         (int)((ulong)((long)pdVar2 -
                      (long)(local_3d8->disks_list).
                            super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3b13b13b;
    std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<foxxll::disk_config*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>>
              ((vector<foxxll::disk_config,std::allocator<foxxll::disk_config>> *)&this->disks_list,
               pdVar2,local_3f8.
                      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                      _M_impl.super__Vector_impl_data._M_start,
               local_3f8.
               super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl
               .super__Vector_impl_data._M_finish);
    if ((pcVar3->disks_list).
        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pcVar3->disks_list).
        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,
                 "virtual void foxxll::config::load_config_file(const std::string &)",0x42);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"No disks found in \'",0x13);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,(local_3e0->_M_dataplus)._M_p,
                          local_3e0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'.",2);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_3d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                               local_418.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (*this->_vptr_config[5])(this);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector(&local_3f8);
  return;
}

Assistant:

void config::load_config_file(const std::string& config_path)
{
    std::vector<disk_config> flash_list;
    std::ifstream cfg_file(config_path.c_str());

    if (!cfg_file)
        return load_default_config();

    std::string line;

    while (std::getline(cfg_file, line))
    {
        // skip comments
        if (line.size() == 0 || line[0] == '#') continue;

        disk_config entry;
        entry.parse_line(line); // throws on errors

        if (!entry.flash)
            disks_list.push_back(entry);
        else
            flash_list.push_back(entry);
    }
    cfg_file.close();

    // put flash devices after regular disks
    first_flash = static_cast<unsigned int>(disks_list.size());
    disks_list.insert(disks_list.end(), flash_list.begin(), flash_list.end());

    if (disks_list.empty()) {
        FOXXLL_THROW(
            std::runtime_error,
            "No disks found in '" << config_path << "'."
        );
    }
}